

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.h
# Opt level: O3

void __thiscall kj::MainBuilder::Validity::~Validity(Validity *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  if (((this->errorMessage).ptr.isSet == true) &&
     (pcVar1 = (this->errorMessage).ptr.field_1.value.content.ptr, pcVar1 != (char *)0x0)) {
    sVar2 = (this->errorMessage).ptr.field_1.value.content.size_;
    (this->errorMessage).ptr.field_1.value.content.ptr = (char *)0x0;
    (this->errorMessage).ptr.field_1.value.content.size_ = 0;
    pAVar3 = (this->errorMessage).ptr.field_1.value.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline Validity(bool valid) {
      if (!valid) errorMessage = heapString("invalid argument");
    }